

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout.cpp
# Opt level: O0

int __thiscall ncnn::Dropout::forward_inplace(Dropout *this,Mat *bottom_top_blob,Option *opt)

{
  long in_RSI;
  Mat *in_RDI;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  float *in_stack_ffffffffffffff60;
  int local_90;
  Mat local_80;
  float *local_40;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  if ((*(float *)&in_RDI[2].cstep != 1.0) || (NAN(*(float *)&in_RDI[2].cstep))) {
    local_24 = *(int *)(in_RSI + 0x2c);
    local_28 = *(int *)(in_RSI + 0x30);
    local_2c = *(int *)(in_RSI + 0x34);
    local_30 = local_24 * local_28;
    for (local_34 = 0; local_34 < local_2c; local_34 = local_34 + 1) {
      Mat::channel(in_RDI,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
      in_stack_ffffffffffffff60 = Mat::operator_cast_to_float_(&local_80);
      Mat::~Mat((Mat *)0x14cba3);
      for (local_90 = 0; local_90 < local_30; local_90 = local_90 + 1) {
        in_stack_ffffffffffffff60[local_90] =
             in_stack_ffffffffffffff60[local_90] * *(float *)&in_RDI[2].cstep;
      }
      local_40 = in_stack_ffffffffffffff60;
    }
  }
  return 0;
}

Assistant:

int Dropout::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (scale == 1.f)
    {
        return 0;
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            ptr[i] = ptr[i] * scale;
        }
    }

    return 0;
}